

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O2

RunResult __thiscall
wabt::interp::Thread::DoSimdBitmask<wabt::interp::Simd<long,(unsigned_char)2>>(Thread *this)

{
  Value VVar1;
  
  VVar1 = Pop(this);
  Push<unsigned_int>(this,(VVar1.field_0._12_4_ >> 0x1e & 0xfffffffe) -
                          (VVar1.field_0._4_4_ >> 0x1f));
  return Ok;
}

Assistant:

RunResult Thread::DoSimdBitmask() {
  auto val = Pop<S>();
  u32 result = 0;
  for (u8 i = 0; i < S::lanes; ++i) {
    if (val[i] < 0) {
      result |= 1 << i;
    }
  }
  Push(result);
  return RunResult::Ok;
}